

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O0

char * cmListFileLexer_GetTypeAsString(cmListFileLexer *lexer,cmListFileLexer_Type type)

{
  cmListFileLexer_Type type_local;
  cmListFileLexer *lexer_local;
  
  switch(type) {
  case cmListFileLexer_Token_None:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f49523;
    break;
  case cmListFileLexer_Token_Space:
    lexer_local = (cmListFileLexer *)0xd82b8d;
    break;
  case cmListFileLexer_Token_Newline:
    lexer_local = (cmListFileLexer *)0xd56ee9;
    break;
  case cmListFileLexer_Token_Identifier:
    lexer_local = (cmListFileLexer *)0xd935ee;
    break;
  case cmListFileLexer_Token_ParenLeft:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f49573;
    break;
  case cmListFileLexer_Token_ParenRight:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f4957e;
    break;
  case cmListFileLexer_Token_ArgumentUnquoted:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f49595;
    break;
  case cmListFileLexer_Token_ArgumentQuoted:
    lexer_local = (cmListFileLexer *)0xd597cf;
    break;
  case cmListFileLexer_Token_ArgumentBracket:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f495c3;
    break;
  case cmListFileLexer_Token_CommentBracket:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f495da;
    break;
  case cmListFileLexer_Token_BadCharacter:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f495e5;
    break;
  case cmListFileLexer_Token_BadBracket:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f495fc;
    break;
  case cmListFileLexer_Token_BadString:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f49613;
    break;
  default:
    lexer_local = (cmListFileLexer *)anon_var_dwarf_f4962a;
  }
  return (char *)lexer_local;
}

Assistant:

const char* cmListFileLexer_GetTypeAsString(cmListFileLexer* lexer,
                                            cmListFileLexer_Type type)
{
  (void)lexer;
  switch (type) {
    case cmListFileLexer_Token_None:
      return "nothing";
    case cmListFileLexer_Token_Space:
      return "space";
    case cmListFileLexer_Token_Newline:
      return "newline";
    case cmListFileLexer_Token_Identifier:
      return "identifier";
    case cmListFileLexer_Token_ParenLeft:
      return "left paren";
    case cmListFileLexer_Token_ParenRight:
      return "right paren";
    case cmListFileLexer_Token_ArgumentUnquoted:
      return "unquoted argument";
    case cmListFileLexer_Token_ArgumentQuoted:
      return "quoted argument";
    case cmListFileLexer_Token_ArgumentBracket:
      return "bracket argument";
    case cmListFileLexer_Token_CommentBracket:
      return "bracket comment";
    case cmListFileLexer_Token_BadCharacter:
      return "bad character";
    case cmListFileLexer_Token_BadBracket:
      return "unterminated bracket";
    case cmListFileLexer_Token_BadString:
      return "unterminated string";
  }
  return "unknown token";
}